

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

Vector3f pbrt::SampleHenyeyGreenstein(Vector3f wo,Float g,Point2f u,Float *pdf)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 in_XMM0_Qb;
  float fVar11;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dd;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_register_00001284 [60];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 in_register_000012c8 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  Vector3f VVar22;
  
  auVar16._8_56_ = in_register_000012c8;
  auVar16._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  auVar14._4_60_ = in_register_00001284;
  auVar14._0_4_ = g;
  fVar11 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  auVar13 = auVar14._0_16_;
  auVar6 = vandps_avx512vl(auVar13,auVar6);
  auVar15 = auVar16._0_16_;
  if (0.001 <= auVar6._0_4_) {
    auVar3 = vfnmadd213ss_fma(auVar13,auVar13,SUB6416(ZEXT464(0x3f800000),0));
    auVar6 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar13,auVar13);
    auVar7 = vfnmadd231ss_fma(ZEXT416((uint)(g + 1.0)),ZEXT416((uint)(g + g)),auVar15);
    auVar7._0_4_ = auVar3._0_4_ / auVar7._0_4_;
    auVar7._4_12_ = auVar3._4_12_;
    auVar6 = vfnmadd231ss_fma(auVar6,auVar7,auVar7);
    auVar3._8_4_ = 0x80000000;
    auVar3._0_8_ = 0x8000000080000000;
    auVar3._12_4_ = 0x80000000;
    auVar6 = vxorps_avx512vl(auVar6,auVar3);
    fVar8 = auVar6._0_4_ / (g + g);
  }
  else {
    auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar15,ZEXT416(0x3f800000));
    fVar8 = auVar6._0_4_;
  }
  auVar6 = vmovshdup_avx(auVar15);
  fVar10 = auVar6._0_4_ * 6.2831855;
  fVar9 = cosf(fVar10);
  fVar10 = sinf(fVar10);
  if (pdf != (Float *)0x0) {
    auVar6 = vfmadd213ss_fma(auVar13,auVar13,SUB6416(ZEXT464(0x3f800000),0));
    auVar15 = vfnmadd213ss_fma(auVar13,auVar13,SUB6416(ZEXT464(0x3f800000),0));
    auVar13 = vfmadd213ss_fma(ZEXT416((uint)(g + g)),ZEXT416((uint)fVar8),auVar6);
    auVar6 = vmaxss_avx(auVar13,ZEXT816(0) << 0x20);
    auVar6 = vsqrtss_avx(auVar6,auVar6);
    *pdf = (auVar15._0_4_ * 0.07957747) / (auVar13._0_4_ * auVar6._0_4_);
  }
  auVar12._8_4_ = 0x3f800000;
  auVar12._0_8_ = 0x3f8000003f800000;
  auVar12._12_4_ = 0x3f800000;
  auVar17._8_4_ = 0x80000000;
  auVar17._0_8_ = 0x8000000080000000;
  auVar17._12_4_ = 0x80000000;
  auVar4._4_4_ = in_XMM1_Db;
  auVar4._0_4_ = fVar11;
  auVar4._8_4_ = 0;
  auVar4._12_4_ = in_XMM1_Dd;
  auVar13._8_8_ = in_XMM0_Qb;
  auVar13._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar15 = vmovshdup_avx(auVar13);
  auVar13 = ZEXT416((uint)fVar8);
  uVar1 = vcmpss_avx512f(auVar13,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar2 = (bool)((byte)uVar1 & 1);
  auVar6 = vfnmadd213ss_fma(ZEXT416((uint)fVar8),auVar13,auVar12);
  auVar7 = vpternlogd_avx512vl(auVar12,auVar4,auVar17,0xf8);
  fVar18 = auVar7._0_4_;
  fVar21 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar6 = vmaxss_avx(auVar6,ZEXT816(0) << 0x40);
  fVar19 = -1.0 / (fVar11 + fVar18);
  auVar6 = vsqrtss_avx(auVar6,auVar6);
  auVar3 = vfmadd213ss_fma(ZEXT416((uint)(fVar21 * fVar21 * fVar18)),ZEXT416((uint)fVar19),auVar12);
  auVar6 = vminss_avx(auVar12,auVar6);
  fVar9 = auVar6._0_4_ * fVar9;
  auVar13 = vminss_avx(auVar12,auVar13);
  fVar10 = fVar10 * auVar6._0_4_;
  fVar20 = auVar15._0_4_;
  fVar8 = fVar21 * fVar20 * fVar19;
  fVar5 = (float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar13._0_4_);
  auVar6 = vfmadd213ss_fma(ZEXT416((uint)(fVar20 * fVar20)),ZEXT416((uint)fVar19),auVar7);
  auVar6 = vinsertps_avx(ZEXT416((uint)(fVar21 * fVar5 + fVar8 * fVar10 + auVar3._0_4_ * fVar9)),
                         ZEXT416((uint)(fVar20 * fVar5 +
                                       fVar18 * fVar8 * fVar9 + auVar6._0_4_ * fVar10)),0x10);
  VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar6._0_8_;
  VVar22.super_Tuple3<pbrt::Vector3,_float>.z =
       fVar11 * fVar5 + (fVar21 * -fVar18 * fVar9 - fVar20 * fVar10);
  return (Vector3f)VVar22.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

Vector3f SampleHenyeyGreenstein(Vector3f wo, Float g, Point2f u, Float *pdf) {
    // Compute $\cos \theta$ for Henyey--Greenstein sample
    Float cosTheta;
    if (std::abs(g) < 1e-3)
        cosTheta = 1 - 2 * u[0];
    else {
        Float sqrTerm = (1 - g * g) / (1 + g - 2 * g * u[0]);
        cosTheta = -(1 + g * g - sqrTerm * sqrTerm) / (2 * g);
    }

    // Compute direction _wi_ for Henyey--Greenstein sample
    Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
    Float phi = 2 * Pi * u[1];
    Frame wFrame = Frame::FromZ(wo);
    Vector3f wi = wFrame.FromLocal(SphericalDirection(sinTheta, cosTheta, phi));

    if (pdf)
        *pdf = HenyeyGreenstein(cosTheta, g);
    return wi;
}